

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<wchar_t,unsigned_long,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *out,unsigned_long value,int num_digits,add_thousands_sep<wchar_t> sep)

{
  undefined8 uVar1;
  type pwVar2;
  int in_EDX;
  wchar_t *in_stack_00000008;
  wchar_t *in_stack_00000010;
  wchar_t *in_stack_00000018;
  wchar_t *end;
  char_type buffer [26];
  char *in_stack_ffffffffffffff18;
  assertion_failure *in_stack_ffffffffffffff20;
  add_thousands_sep<wchar_t> in_stack_ffffffffffffff70;
  
  if (in_EDX < 0) {
    uVar1 = __cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar1,&assertion_failure::typeinfo,assertion_failure::~assertion_failure);
  }
  format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
            (in_stack_00000018,(unsigned_long)in_stack_00000010,
             (int)((ulong)in_stack_00000008 >> 0x20),in_stack_ffffffffffffff70);
  pwVar2 = copy_str<wchar_t,wchar_t*,wchar_t*>
                     (in_stack_00000010,in_stack_00000008,(wchar_t *)0x1280a2);
  return pwVar2;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}